

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_addsub.h
# Opt level: O3

uint32_t helper_uqaddsubx_arm(uint32_t a,uint32_t b)

{
  ushort uVar1;
  int iVar2;
  ushort uVar3;
  ushort uVar4;
  
  uVar1 = (ushort)(b >> 0x10);
  uVar3 = (ushort)a - uVar1;
  if ((ushort)a < uVar1) {
    uVar3 = 0;
  }
  uVar4 = (ushort)(a >> 0x10);
  iVar2 = 0xffff;
  if (!CARRY2((ushort)b,uVar4)) {
    iVar2 = CONCAT22(uVar1,(ushort)b + uVar4);
  }
  return iVar2 << 0x10 | (uint)uVar3;
}

Assistant:

uint32_t HELPER(glue(PFX,addsubx))(uint32_t a, uint32_t b GE_ARG)
{
    uint32_t res = 0;
    DECLARE_GE;

    SUB16(a, b >> 16, 0);
    ADD16(a >> 16, b, 1);
    SET_GE;
    return res;
}